

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storage.hpp
# Opt level: O2

void __thiscall
benchmarks::StorageArray<std::function<void_()>_>::StorageArray
          (StorageArray<std::function<void_()>_> *this,int64_t size)

{
  int64_t *piVar1;
  
  this->_size = size;
  piVar1 = (int64_t *)operator_new__(-(ulong)((ulong)size >> 0x3b != 0) | size << 5 | 8);
  *piVar1 = size;
  this->_arr = (Storage<std::function<void_()>_> *)(piVar1 + 1);
  return;
}

Assistant:

StorageArray(int64_t size)
			: _size(size)
		{ _arr = new Storage<T_>[size]; }